

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator*(TPZFMatrix<Fad<float>_> *this,Fad<float> *value)

{
  Fad<float> *in_RDX;
  TPZFMatrix<Fad<float>_> *in_RDI;
  TPZFMatrix<Fad<float>_> *in_stack_00000028;
  TPZFMatrix<Fad<float>_> *in_stack_00000030;
  TPZFMatrix<Fad<float>_> *res;
  Fad<float> *in_stack_ffffffffffffffb0;
  Fad<float> *in_stack_ffffffffffffffc8;
  TPZFMatrix<Fad<float>_> *in_stack_ffffffffffffffd0;
  
  TPZFMatrix(in_stack_00000030,in_stack_00000028);
  Fad<float>::Fad(in_stack_ffffffffffffffb0,in_RDX);
  operator*=(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  Fad<float>::~Fad((Fad<float> *)in_RDI);
  return in_RDI;
}

Assistant:

TPZFMatrix<TVar>
TPZFMatrix<TVar>::operator*(const TVar value ) const
{
    auto res(*this);
    res *= value;
    return res;
}